

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

OwnFd * __thiscall kj::Vector<kj::OwnFd>::add<kj::OwnFd>(Vector<kj::OwnFd> *this,OwnFd *params)

{
  OwnFd *pOVar1;
  
  pOVar1 = (this->builder).pos;
  if (pOVar1 == (this->builder).endPtr) {
    grow(this,0);
    pOVar1 = (this->builder).pos;
  }
  pOVar1->fd = params->fd;
  params->fd = -1;
  (this->builder).pos = pOVar1 + 1;
  return pOVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }